

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trace.h
# Opt level: O1

void __thiscall NULLC::TraceContext::~TraceContext(TraceContext *this)

{
  uint uVar1;
  char *pcVar2;
  TraceEvent *pTVar3;
  TraceScopeToken *pTVar4;
  
  TraceDump();
  if ((this->output).stream != (void *)0x0) {
    uVar1 = (this->output).outputBufPos;
    (this->output).outputBufPos = uVar1 + 1;
    (this->output).outputBuf[uVar1] = ']';
    uVar1 = (this->output).outputBufPos;
    if (uVar1 == (this->output).outputBufSize) {
      (*(this->output).writeStream)((this->output).stream,(this->output).outputBuf,uVar1);
      (this->output).outputBufPos = 0;
    }
    uVar1 = (this->output).outputBufPos;
    if (uVar1 != 0) {
      (*(this->output).writeStream)((this->output).stream,(this->output).outputBuf,uVar1);
    }
    (this->output).outputBufPos = 0;
    (*(this->output).closeStream)((this->output).stream);
    (this->output).stream = (void *)0x0;
  }
  pcVar2 = (this->tempBuf).data;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  pcVar2 = (this->outputBuf).data;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  pTVar3 = (this->events).data;
  if (pTVar3 != (TraceEvent *)0x0) {
    operator_delete__(pTVar3);
  }
  pcVar2 = (this->labels).data;
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  pTVar4 = (this->scopeTokens).data;
  if (pTVar4 != (TraceScopeToken *)0x0) {
    operator_delete__(pTVar4);
  }
  OutputContext::~OutputContext(&this->output);
  return;
}

Assistant:

~TraceContext()
		{
			TraceDump();

			if(output.stream)
			{
				output.Print(']');
				output.Flush();

				output.closeStream(output.stream);
				output.stream = NULL;
			}
		}